

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O1

CURLcode Curl_connect(Curl_easy *data,_Bool *asyncp,_Bool *protocol_done)

{
  char **passwordp;
  byte bVar1;
  curl_proxytype cVar2;
  char *pcVar3;
  bool bVar4;
  _Bool _Var5;
  char cVar6;
  unsigned_short uVar7;
  CURLUcode CVar8;
  CURLUcode CVar9;
  int iVar10;
  uchar *ch;
  size_t sVar11;
  size_t sVar12;
  connectdata *conn;
  ssl_backend_data *psVar13;
  char *pcVar14;
  CURLU *pCVar15;
  char *pcVar16;
  void *pvVar17;
  long lVar18;
  connectbundle *bundle;
  connectdata *pcVar19;
  size_t sVar20;
  ulong uVar21;
  byte bVar22;
  byte bVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  Curl_handler **ppCVar27;
  Curl_easy *pCVar28;
  undefined1 *puVar29;
  uint uVar30;
  Curl_handler *pCVar31;
  urlpieces *puVar32;
  urlpieces *puVar33;
  urlpieces *puVar34;
  char **ppcVar35;
  bool bVar36;
  bool bVar37;
  curltime cVar38;
  _Bool waitpipe;
  _Bool force_reuse;
  connectdata *conn_temp;
  char *zoneid;
  _Bool local_2a2;
  _Bool local_2a1;
  urlpieces *local_2a0;
  char *local_298;
  char *local_290;
  size_t local_288;
  size_t local_280;
  connectdata *local_278;
  char *local_270;
  char *local_268;
  _Bool *local_260;
  _Bool *local_258;
  char *local_250;
  Curl_easy *local_248;
  char *local_240;
  char *local_238 [31];
  undefined1 local_139;
  char *local_138 [31];
  undefined1 local_39;
  
  conn = (connectdata *)0x0;
  *asyncp = false;
  local_258 = protocol_done;
  (*Curl_cfree)((data->req).protop);
  (data->req).protop = (void *)0x0;
  (*Curl_cfree)((data->req).newurl);
  memset(&data->req,0,0x578);
  (data->req).maxdownload = -1;
  local_278 = (connectdata *)0x0;
  local_2a1 = false;
  local_2a2 = false;
  sVar11 = Curl_multi_max_host_connections(data->multi);
  sVar12 = Curl_multi_max_total_connections(data->multi);
  *asyncp = false;
  local_260 = asyncp;
  if ((data->change).url == (char *)0x0) {
    CVar8 = CURLUE_MALFORMED_INPUT;
    goto LAB_0048b1c5;
  }
  local_288 = sVar11;
  local_280 = sVar12;
  conn = (connectdata *)(*Curl_ccalloc)(1,0x630);
  if (conn == (connectdata *)0x0) {
LAB_0048a46b:
    conn = (connectdata *)0x0;
  }
  else {
    sVar11 = Curl_ssl->sizeof_ssl_backend_data;
    psVar13 = (ssl_backend_data *)(*Curl_ccalloc)(4,sVar11);
    if (psVar13 == (ssl_backend_data *)0x0) {
      (*Curl_cfree)(conn);
    }
    else {
      conn->ssl_extra = psVar13;
      conn->ssl[0].backend = psVar13;
      conn->ssl[1].backend = (ssl_backend_data *)((psVar13->tap_state).master_key + (sVar11 - 0x1c))
      ;
      conn->proxy_ssl[0].backend =
           (ssl_backend_data *)((psVar13->tap_state).master_key + sVar11 * 2 + -0x1c);
      conn->proxy_ssl[1].backend =
           (ssl_backend_data *)((psVar13->tap_state).master_key + sVar11 * 3 + -0x1c);
    }
    uVar30 = 0;
    if (psVar13 == (ssl_backend_data *)0x0) goto LAB_0048a46b;
    conn->handler = &Curl_handler_dummy;
    conn->connection_id = -1;
    conn->port = -1;
    conn->remote_port = -1;
    conn->sock[0] = -1;
    conn->sock[1] = -1;
    conn->tempsock[0] = -1;
    conn->tempsock[1] = -1;
    Curl_conncontrol(conn,1);
    cVar38 = Curl_now();
    (conn->created).tv_sec = cVar38.tv_sec;
    (conn->created).tv_usec = cVar38.tv_usec;
    cVar38 = Curl_now();
    (conn->keepalive).tv_sec = cVar38.tv_sec;
    (conn->keepalive).tv_usec = cVar38.tv_usec;
    conn->upkeep_interval_ms = (data->set).upkeep_interval_ms;
    conn->data = data;
    cVar2 = (data->set).proxytype;
    (conn->http_proxy).proxytype = cVar2;
    (conn->socks_proxy).proxytype = CURLPROXY_SOCKS4;
    pcVar14 = (data->set).str[0x15];
    if (pcVar14 != (char *)0x0) {
      uVar30 = (uint)(*pcVar14 != '\0') << 4;
    }
    uVar25 = *(uint *)&(conn->bits).field_0x4;
    *(uint *)&(conn->bits).field_0x4 = uVar25 & 0xffffffef | uVar30;
    if (uVar30 == 0) {
      uVar26 = 0;
    }
    else {
      uVar26 = 0x20;
      if (CURLPROXY_HTTP_1_0 < cVar2) {
        uVar26 = (uint)(cVar2 == CURLPROXY_HTTPS) << 5;
      }
    }
    uVar24 = uVar26 * 2 ^ 0x40;
    if (uVar30 == 0) {
      uVar24 = 0;
    }
    uVar30 = uVar24 | uVar26 | uVar25 & 0xffffff8f | uVar30;
    *(uint *)&(conn->bits).field_0x4 = uVar30;
    pcVar14 = (data->set).str[0x16];
    if ((pcVar14 != (char *)0x0) && (*pcVar14 != '\0')) {
      *(uint *)&(conn->bits).field_0x4 = uVar30 | 0x50;
    }
    uVar25 = (uint)((data->set).str[0x2f] != (char *)0x0) << 8;
    uVar30 = *(uint *)&(conn->bits).field_0x4;
    *(uint *)&(conn->bits).field_0x4 = uVar30 & 0xfffffeff | uVar25;
    uVar26 = (*(uint *)&(data->set).field_0x878 & 0x400) << 4;
    *(uint *)&(conn->bits).field_0x4 = uVar30 & 0xffffbeff | uVar25 | uVar26;
    uVar24 = (uint)((data->set).str[0x2c] != (char *)0x0) << 7;
    *(uint *)&(conn->bits).field_0x4 = uVar30 & 0xffffbe7f | uVar25 | uVar26 | uVar24;
    uVar30 = (uVar30 & 0xfffdbe7f | uVar25 | uVar26 | uVar24) +
             (*(uint *)&(data->set).field_0x878 & 0x8000) * 4;
    *(uint *)&(conn->bits).field_0x4 = uVar30;
    uVar30 = (uVar30 & 0xfffbffff) + (*(uint *)&(data->set).field_0x878 & 0x10000) * 4;
    *(uint *)&(conn->bits).field_0x4 = uVar30;
    bVar22 = (data->set).ssl.primary.field_0x48 & 4;
    bVar1 = (conn->ssl_config).field_0x48;
    (conn->ssl_config).field_0x48 = bVar1 & 0xfb | bVar22;
    bVar23 = (data->set).ssl.primary.field_0x48 & 1;
    (conn->ssl_config).field_0x48 = bVar1 & 0xfa | bVar22 | bVar23;
    (conn->ssl_config).field_0x48 =
         bVar1 & 0xf8 | bVar22 | bVar23 | (data->set).ssl.primary.field_0x48 & 2;
    bVar22 = (data->set).proxy_ssl.primary.field_0x48 & 4;
    bVar1 = (conn->proxy_ssl_config).field_0x48;
    (conn->proxy_ssl_config).field_0x48 = bVar1 & 0xfb | bVar22;
    bVar23 = (data->set).proxy_ssl.primary.field_0x48 & 1;
    (conn->proxy_ssl_config).field_0x48 = bVar1 & 0xfa | bVar22 | bVar23;
    (conn->proxy_ssl_config).field_0x48 =
         bVar1 & 0xf8 | bVar22 | bVar23 | (data->set).proxy_ssl.primary.field_0x48 & 2;
    conn->ip_version = (data->set).ipver;
    *(uint *)&(conn->bits).field_0x4 =
         uVar30 & 0x7fffffff | (uint)(*(ulong *)&(data->set).field_0x878 >> 6) & 0x80000000;
    Curl_llist_init(&conn->easyq,llist_dtor);
    pcVar14 = (data->set).str[8];
    if (pcVar14 != (char *)0x0) {
      pcVar14 = (*Curl_cstrdup)(pcVar14);
      conn->localdev = pcVar14;
      if (pcVar14 == (char *)0x0) {
        Curl_llist_destroy(&conn->easyq,(void *)0x0);
        (*Curl_cfree)(conn->localdev);
        (*Curl_cfree)(conn->ssl_extra);
        (*Curl_cfree)(conn);
        goto LAB_0048a46b;
      }
    }
    conn->localportrange = (data->set).localportrange;
    conn->localport = (data->set).localport;
    conn->fclosesocket = (data->set).fclosesocket;
    conn->closesocket_client = (data->set).closesocket_client;
  }
  if (conn == (connectdata *)0x0) {
    CVar8 = CURLUE_NO_QUERY|CURLUE_NO_USER;
    goto LAB_0048a494;
  }
  up_free(data);
  pCVar15 = (data->set).uh;
  if (pCVar15 == (CURLU *)0x0) {
    pCVar15 = curl_url();
  }
  else {
    pCVar15 = curl_url_dup(pCVar15);
  }
  (data->state).uh = pCVar15;
  if (pCVar15 == (CURLU *)0x0) goto switchD_0048a55b_caseD_7;
  if (((data->set).str[7] != (char *)0x0) &&
     (_Var5 = Curl_is_absolute_url((data->change).url,(char *)0x0,0x28), !_Var5)) {
    if (((data->change).field_0x20 & 1) != 0) {
      (*Curl_cfree)((data->change).url);
    }
    pcVar14 = curl_maprintf("%s://%s",(data->set).str[7],(data->change).url);
    if (pcVar14 == (char *)0x0) goto switchD_0048a55b_caseD_7;
    (data->change).url = pcVar14;
    puVar29 = &(data->change).field_0x20;
    *puVar29 = *puVar29 | 1;
  }
  if ((data->set).uh == (CURLU *)0x0) {
    uVar30 = (uint)((ulong)*(undefined8 *)&(data->set).field_0x878 >> 0x20);
    CVar9 = curl_url_set(pCVar15,CURLUPART_URL,(data->change).url,
                         (uVar30 >> 0x11 & 0x20) + (uVar30 >> 0xb & 0x10) + 0x208);
    CVar8 = CURLUE_MALFORMED_INPUT;
    switch(CVar9) {
    case CURLUE_OK:
      break;
    default:
      goto switchD_0048a628_caseD_1;
    case CURLUE_UNSUPPORTED_SCHEME:
      goto switchD_0048a55b_caseD_5;
    case CURLUE_OUT_OF_MEMORY:
      goto switchD_0048a55b_caseD_7;
    case CURLUE_USER_NOT_ALLOWED:
      goto switchD_0048a55b_caseD_8;
    }
  }
  puVar32 = &(data->state).up;
  CVar8 = curl_url_get(pCVar15,CURLUPART_SCHEME,&puVar32->scheme,0);
  switch(CVar8) {
  case CURLUE_OK:
    pcVar14 = puVar32->scheme;
    pCVar31 = &Curl_handler_http;
    ppCVar27 = protocols;
    local_2a0 = puVar32;
    do {
      ppCVar27 = ppCVar27 + 1;
      iVar10 = Curl_strcasecompare(pCVar31->scheme,pcVar14);
      if (iVar10 != 0) goto LAB_0048a593;
      pCVar31 = *ppCVar27;
    } while (pCVar31 != (Curl_handler *)0x0);
    pCVar31 = (Curl_handler *)0x0;
LAB_0048a593:
    if (((pCVar31 == (Curl_handler *)0x0) ||
        (((uint)(data->set).allowed_protocols & pCVar31->protocol) == 0)) ||
       ((((data->state).field_0x4e4 & 2) != 0 &&
        (((uint)(data->set).redir_protocols & pCVar31->protocol) == 0)))) {
      bVar36 = false;
      Curl_failf(data,"Protocol \"%s\" not supported or disabled in libcurl",pcVar14);
      CVar8 = CURLUE_BAD_HANDLE;
    }
    else {
      conn->given = pCVar31;
      conn->handler = pCVar31;
      CVar8 = CURLUE_OK;
      bVar36 = true;
    }
    if (bVar36) {
      ppcVar35 = &(data->state).up.user;
      CVar9 = curl_url_get(pCVar15,CURLUPART_USER,ppcVar35,0x40);
      CVar8 = CURLUE_MALFORMED_INPUT;
      switch(CVar9) {
      case CURLUE_OK:
        pcVar14 = (*Curl_cstrdup)(*ppcVar35);
        conn->user = pcVar14;
        if (pcVar14 != (char *)0x0) {
          puVar29 = &(conn->bits).field_0x4;
          *puVar29 = *puVar29 | 0x80;
          goto switchD_0048a695_caseD_b;
        }
      case CURLUE_OUT_OF_MEMORY:
switchD_0048a55b_caseD_7:
        CVar8 = CURLUE_NO_QUERY|CURLUE_NO_USER;
        break;
      case CURLUE_BAD_HANDLE:
      case CURLUE_BAD_PARTPOINTER:
      case CURLUE_MALFORMED_INPUT:
      case CURLUE_BAD_PORT_NUMBER:
      case CURLUE_URLDECODE:
      case CURLUE_UNKNOWN_PART:
      case CURLUE_NO_SCHEME:
        break;
      case CURLUE_UNSUPPORTED_SCHEME:
        goto switchD_0048a55b_caseD_5;
      case CURLUE_USER_NOT_ALLOWED:
        goto switchD_0048a55b_caseD_8;
      case CURLUE_NO_USER:
switchD_0048a695_caseD_b:
        ppcVar35 = &(data->state).up.password;
        CVar8 = CURLUE_MALFORMED_INPUT;
        CVar9 = curl_url_get(pCVar15,CURLUPART_PASSWORD,ppcVar35,0x40);
        switch(CVar9) {
        case CURLUE_UNSUPPORTED_SCHEME:
          goto switchD_0048a55b_caseD_5;
        case CURLUE_URLDECODE:
        case CURLUE_UNKNOWN_PART:
        case CURLUE_NO_SCHEME:
        case CURLUE_NO_USER:
          break;
        case CURLUE_OUT_OF_MEMORY:
          goto switchD_0048a55b_caseD_7;
        case CURLUE_USER_NOT_ALLOWED:
          goto switchD_0048a55b_caseD_8;
        case CURLUE_NO_PASSWORD:
switchD_0048a6f5_caseD_c:
          ppcVar35 = &(data->state).up.options;
          CVar9 = curl_url_get(pCVar15,CURLUPART_OPTIONS,ppcVar35,0x40);
          switch(CVar9) {
          case CURLUE_UNSUPPORTED_SCHEME:
            goto switchD_0048a55b_caseD_5;
          case CURLUE_URLDECODE:
          case CURLUE_UNKNOWN_PART:
          case CURLUE_NO_SCHEME:
          case CURLUE_NO_USER:
          case CURLUE_NO_PASSWORD:
            break;
          case CURLUE_OUT_OF_MEMORY:
            goto switchD_0048a55b_caseD_7;
          case CURLUE_USER_NOT_ALLOWED:
            goto switchD_0048a55b_caseD_8;
          case CURLUE_NO_OPTIONS:
switchD_0048a76d_caseD_d:
            CVar9 = curl_url_get(pCVar15,CURLUPART_HOST,&(data->state).up.hostname,0);
            if ((CVar9 != CURLUE_OK) &&
               (iVar10 = Curl_strcasecompare("file",local_2a0->scheme), iVar10 == 0))
            goto switchD_0048a55b_caseD_7;
            CVar9 = curl_url_get(pCVar15,CURLUPART_PATH,&(data->state).up.path,0);
            switch(CVar9) {
            case CURLUE_OK:
              ppcVar35 = &(data->state).up.port;
              CVar8 = curl_url_get(pCVar15,CURLUPART_PORT,ppcVar35,1);
              if (CVar8 == CURLUE_OK) {
                uVar21 = strtoul(*ppcVar35,(char **)0x0,10);
                uVar7 = curlx_ultous(uVar21);
                conn->remote_port = (uint)uVar7;
              }
              else {
                iVar10 = Curl_strcasecompare("file",local_2a0->scheme);
                if (iVar10 == 0) goto switchD_0048a55b_caseD_7;
              }
              curl_url_get(pCVar15,CURLUPART_QUERY,&(data->state).up.query,0);
              pcVar14 = (data->state).up.hostname;
              pcVar16 = "";
              if (pcVar14 != (char *)0x0) {
                pcVar16 = pcVar14;
              }
              if (*pcVar16 == '[') {
                CVar8 = curl_url_get(pCVar15,CURLUPART_ZONEID,local_238,0);
                puVar29 = &(conn->bits).field_0x5;
                *puVar29 = *puVar29 | 2;
                pcVar14 = pcVar16 + 1;
                sVar20 = strlen(pcVar14);
                pcVar16[sVar20] = '\0';
                pcVar16 = pcVar14;
                if ((char *)CONCAT71(local_238[0]._1_7_,(char)local_238[0]) != (char *)0x0 &&
                    CVar8 == CURLUE_OK) {
                  uVar21 = strtoul((char *)CONCAT71(local_238[0]._1_7_,(char)local_238[0]),local_138
                                   ,10);
                  if (uVar21 < 0xffffffff &&
                      *(char *)CONCAT71(local_138[0]._1_7_,(char)local_138[0]) == '\0') {
                    conn->scope_id = (uint)uVar21;
                  }
                  (*Curl_cfree)((void *)CONCAT71(local_238[0]._1_7_,(char)local_238[0]));
                }
              }
              pcVar14 = (*Curl_cstrdup)(pcVar16);
              (conn->host).rawalloc = pcVar14;
              CVar8 = CURLUE_NO_QUERY|CURLUE_NO_USER;
              if (pcVar14 != (char *)0x0) {
                (conn->host).name = pcVar14;
                uVar30 = (data->set).scope_id;
                CVar8 = CURLUE_OK;
                if (uVar30 != 0) {
                  conn->scope_id = uVar30;
                  CVar8 = CURLUE_OK;
                }
              }
              break;
            case CURLUE_UNSUPPORTED_SCHEME:
              goto switchD_0048a55b_caseD_5;
            case CURLUE_OUT_OF_MEMORY:
              goto switchD_0048a55b_caseD_7;
            case CURLUE_USER_NOT_ALLOWED:
              goto switchD_0048a55b_caseD_8;
            }
            break;
          default:
            if (CVar9 == CURLUE_OK) {
              pcVar14 = (*Curl_cstrdup)(*ppcVar35);
              conn->options = pcVar14;
              if (pcVar14 != (char *)0x0) goto switchD_0048a76d_caseD_d;
              goto switchD_0048a55b_caseD_7;
            }
          }
          break;
        default:
          if (CVar9 == CURLUE_OK) {
            pcVar14 = (*Curl_cstrdup)(*ppcVar35);
            conn->passwd = pcVar14;
            if (pcVar14 != (char *)0x0) {
              puVar29 = &(conn->bits).field_0x4;
              *puVar29 = *puVar29 | 0x80;
              goto switchD_0048a6f5_caseD_c;
            }
            goto switchD_0048a55b_caseD_7;
          }
        }
        break;
      default:
        goto switchD_0048a55b_caseD_1;
      }
    }
    break;
  default:
switchD_0048a55b_caseD_1:
    CVar8 = CURLUE_MALFORMED_INPUT;
    break;
  case CURLUE_UNSUPPORTED_SCHEME:
switchD_0048a55b_caseD_5:
    CVar8 = CURLUE_BAD_HANDLE;
    break;
  case CURLUE_OUT_OF_MEMORY:
    goto switchD_0048a55b_caseD_7;
  case CURLUE_USER_NOT_ALLOWED:
switchD_0048a55b_caseD_8:
    CVar8 = 0x43;
  }
switchD_0048a628_caseD_1:
  if (CVar8 != CURLUE_OK) goto LAB_0048b1c5;
  pcVar14 = (data->set).str[0x39];
  if (pcVar14 != (char *)0x0) {
    pcVar14 = (*Curl_cstrdup)(pcVar14);
    conn->oauth_bearer = pcVar14;
    if (pcVar14 == (char *)0x0) {
      CVar8 = CURLUE_NO_QUERY|CURLUE_NO_USER;
      goto LAB_0048b1c5;
    }
  }
  pCVar28 = conn->data;
  if (((conn->bits).field_0x5 & 1) == 0) {
LAB_0048a942:
    pcVar14 = (pCVar28->set).str[0x15];
    if (pcVar14 != (char *)0x0) {
      pcVar14 = (*Curl_cstrdup)(pcVar14);
      if (pcVar14 != (char *)0x0) goto LAB_0048a98b;
      Curl_failf(pCVar28,"memory shortage");
      pcVar16 = (char *)0x0;
      CVar8 = CURLUE_NO_QUERY|CURLUE_NO_USER;
      goto LAB_0048ae5a;
    }
    pcVar14 = (char *)0x0;
LAB_0048a98b:
    pcVar16 = (pCVar28->set).str[0x16];
    if (pcVar16 == (char *)0x0) {
      pcVar16 = (char *)0x0;
LAB_0048a9c5:
      local_270 = pcVar16;
      local_268 = pcVar14;
      if ((pCVar28->set).str[0x31] == (char *)0x0) {
        pcVar16 = "no_proxy";
        pcVar14 = curl_getenv("no_proxy");
        if (pcVar14 == (char *)0x0) {
          pcVar16 = "NO_PROXY";
          pcVar14 = curl_getenv("NO_PROXY");
        }
        if (pcVar14 != (char *)0x0) {
          Curl_infof(conn->data,"Uses proxy env variable %s == \'%s\'\n",pcVar16,pcVar14);
        }
      }
      else {
        pcVar14 = (char *)0x0;
      }
      pcVar16 = (pCVar28->set).str[0x31];
      if (pcVar16 == (char *)0x0) {
        pcVar16 = pcVar14;
      }
      local_240 = pcVar14;
      if ((pcVar16 == (char *)0x0) || (*pcVar16 == '\0')) {
LAB_0048abea:
        pcVar14 = local_268;
        pcVar16 = local_270;
        if (local_268 == (char *)0x0 && local_270 == (char *)0x0) {
          pcVar14 = conn->handler->scheme;
          cVar6 = *pcVar14;
          if (cVar6 == '\0') {
            ppcVar35 = local_238;
          }
          else {
            ppcVar35 = local_238;
            do {
              pcVar14 = pcVar14 + 1;
              iVar10 = tolower((int)cVar6);
              *(char *)ppcVar35 = (char)iVar10;
              ppcVar35 = (char **)((long)ppcVar35 + 1);
              cVar6 = *pcVar14;
            } while (cVar6 != '\0');
          }
          *(undefined4 *)((long)ppcVar35 + 3) = 0x79786f;
          *(undefined4 *)ppcVar35 = 0x6f72705f;
          pcVar16 = (char *)local_238;
          pcVar14 = curl_getenv(pcVar16);
          if (pcVar14 == (char *)0x0) {
            iVar10 = Curl_strcasecompare("http_proxy",(char *)local_238);
            if (iVar10 == 0) {
              Curl_strntoupper((char *)local_238,(char *)local_238,0x80);
              pcVar14 = curl_getenv((char *)local_238);
            }
            else {
              pcVar14 = (char *)0x0;
            }
          }
          if (pcVar14 == (char *)0x0) {
            pcVar16 = "all_proxy";
            pcVar14 = curl_getenv("all_proxy");
            if (pcVar14 == (char *)0x0) {
              pcVar16 = "ALL_PROXY";
              pcVar14 = curl_getenv("ALL_PROXY");
            }
          }
          if (pcVar14 != (char *)0x0) {
            Curl_infof(conn->data,"Uses proxy env variable %s == \'%s\'\n",pcVar16,pcVar14);
          }
          pcVar16 = (char *)0x0;
        }
      }
      else {
        local_298 = (conn->host).name;
        iVar10 = Curl_strcasecompare("*",pcVar16);
        if (iVar10 == 0) {
          local_2a0 = (urlpieces *)strlen(pcVar16);
          if (*local_298 == '[') {
            local_290 = strchr(local_298,0x5d);
            if (local_290 == (char *)0x0) goto LAB_0048abea;
            local_298 = local_298 + 1;
            local_290 = local_290 + -(long)local_298;
          }
          else {
            local_290 = (char *)strlen(local_298);
          }
          if (local_2a0 != (urlpieces *)0x0) {
            local_298 = local_298 + (long)local_290;
            puVar32 = (urlpieces *)0x0;
            local_248 = pCVar28;
            do {
              puVar33 = (urlpieces *)((long)&puVar32->scheme + 1);
              if (puVar33 < local_2a0) {
                puVar33 = local_2a0;
              }
              do {
                pvVar17 = memchr(", ",(int)pcVar16[(long)puVar32],3);
                pCVar28 = local_248;
                puVar34 = puVar32;
                if (pvVar17 == (void *)0x0) break;
                puVar32 = (urlpieces *)((long)&puVar32->scheme + 1);
                puVar34 = puVar33;
              } while (puVar33 != puVar32);
              if (puVar34 == local_2a0) break;
              puVar32 = puVar34;
              puVar33 = puVar34;
              if (puVar34 < local_2a0) {
                do {
                  pvVar17 = memchr(", ",(int)pcVar16[(long)puVar33],3);
                  puVar32 = puVar33;
                  if (pvVar17 != (void *)0x0) break;
                  puVar33 = (urlpieces *)((long)&puVar33->scheme + 1);
                  puVar32 = local_2a0;
                } while (local_2a0 != puVar33);
              }
              puVar29 = (undefined1 *)
                        ((long)&puVar34->scheme + (ulong)(pcVar16[(long)puVar34] == '.'));
              pcVar14 = (char *)((long)puVar32 - (long)puVar29);
              if (pcVar14 <= local_290) {
                local_250 = local_298 + -(long)pcVar14;
                iVar10 = Curl_strncasecompare(pcVar16 + (long)puVar29,local_250,(size_t)pcVar14);
                if ((iVar10 != 0) && ((pcVar14 == local_290 || (local_250[-1] == '.'))))
                goto LAB_0048aa6b;
              }
              puVar32 = (urlpieces *)((long)&puVar32->scheme + 1);
            } while (puVar32 < local_2a0);
          }
          goto LAB_0048abea;
        }
LAB_0048aa6b:
        (*Curl_cfree)(local_268);
        (*Curl_cfree)(local_270);
        pcVar14 = (char *)0x0;
        pcVar16 = (char *)0x0;
      }
      (*Curl_cfree)(local_240);
      if (pcVar14 == (char *)0x0) {
LAB_0048ad18:
        pcVar14 = (char *)0x0;
      }
      else if ((*pcVar14 == '\0') || ((conn->handler->flags & 0x10) != 0)) {
        (*Curl_cfree)(pcVar14);
        goto LAB_0048ad18;
      }
      if (pcVar16 == (char *)0x0) {
LAB_0048ad3e:
        pcVar16 = (char *)0x0;
      }
      else if ((*pcVar16 == '\0') || ((conn->handler->flags & 0x10) != 0)) {
        (*Curl_cfree)(pcVar16);
        goto LAB_0048ad3e;
      }
      if (pcVar14 == (char *)0x0 && pcVar16 == (char *)0x0) {
        uVar30 = *(uint *)&(conn->bits).field_0x4 & 0xffffff9f;
      }
      else {
        if (pcVar14 != (char *)0x0) {
          CVar8 = parse_proxy(pCVar28,conn,pcVar14,(conn->http_proxy).proxytype);
          (*Curl_cfree)(pcVar14);
          if (CVar8 != CURLUE_OK) goto LAB_0048ae5a;
        }
        if (pcVar16 != (char *)0x0) {
          CVar8 = parse_proxy(pCVar28,conn,pcVar16,(conn->socks_proxy).proxytype);
          (*Curl_cfree)(pcVar16);
          if (CVar8 != CURLUE_OK) goto LAB_0048a93b;
        }
        pcVar14 = (conn->http_proxy).host.rawalloc;
        if (pcVar14 == (char *)0x0) {
          uVar30 = *(uint *)&(conn->bits).field_0x4 & 0xffffbfdf;
        }
        else {
          if ((conn->handler->protocol & 3) == 0) {
            if (((conn->handler->flags & 0x800) == 0) || (((conn->bits).field_0x5 & 0x40) != 0)) {
              puVar29 = &(conn->bits).field_0x5;
              *puVar29 = *puVar29 | 0x40;
            }
            else {
              conn->handler = &Curl_handler_http;
            }
          }
          uVar30 = *(uint *)&(conn->bits).field_0x4 | 0x20;
        }
        *(uint *)&(conn->bits).field_0x4 = uVar30;
        if ((conn->socks_proxy).host.rawalloc == (char *)0x0) {
          uVar30 = uVar30 & 0xffffffbf;
        }
        else {
          if ((pcVar14 == (char *)0x0) && ((conn->socks_proxy).user == (char *)0x0)) {
            pcVar14 = (conn->socks_proxy).passwd;
            (conn->socks_proxy).user = (conn->http_proxy).user;
            (conn->http_proxy).user = (char *)0x0;
            (*Curl_cfree)(pcVar14);
            (conn->socks_proxy).passwd = (conn->http_proxy).passwd;
            (conn->http_proxy).passwd = (char *)0x0;
          }
          uVar30 = *(uint *)&(conn->bits).field_0x4 | 0x40;
        }
      }
      uVar25 = 0x10;
      if ((uVar30 & 0x20) == 0) {
        uVar25 = uVar30 >> 2 & 0x10;
      }
      *(uint *)&(conn->bits).field_0x4 = uVar30 & 0xffffffef | uVar25;
      if (uVar25 == 0) {
        *(uint *)&(conn->bits).field_0x4 = uVar30 & 0xffffbe8f;
      }
      pcVar16 = (char *)0x0;
      CVar8 = CURLUE_OK;
      goto LAB_0048ae5a;
    }
    pcVar16 = (*Curl_cstrdup)(pcVar16);
    if (pcVar16 != (char *)0x0) goto LAB_0048a9c5;
    Curl_failf(pCVar28,"memory shortage");
    pcVar16 = (char *)0x0;
    CVar8 = CURLUE_NO_QUERY|CURLUE_NO_USER;
  }
  else {
    memset(local_238,0,0x100);
    memset(local_138,0,0x100);
    pcVar14 = (pCVar28->set).str[0x2f];
    if (pcVar14 != (char *)0x0) {
      strncpy((char *)local_238,pcVar14,0x100);
      local_139 = 0;
    }
    pcVar14 = (pCVar28->set).str[0x30];
    if (pcVar14 != (char *)0x0) {
      strncpy((char *)local_138,pcVar14,0x100);
      local_39 = 0;
    }
    CVar8 = Curl_urldecode(pCVar28,(char *)local_238,0,&(conn->http_proxy).user,(size_t *)0x0,false)
    ;
    if (CVar8 == CURLUE_OK) {
      CVar8 = Curl_urldecode(pCVar28,(char *)local_138,0,&(conn->http_proxy).passwd,(size_t *)0x0,
                             false);
    }
    if (CVar8 == CURLUE_OK) goto LAB_0048a942;
LAB_0048a93b:
    pcVar16 = (char *)0x0;
LAB_0048ae5a:
    pcVar14 = (char *)0x0;
  }
  (*Curl_cfree)(pcVar16);
  (*Curl_cfree)(pcVar14);
  if (CVar8 != CURLUE_OK) goto LAB_0048b1c5;
  if (((conn->given->flags & 1) != 0) &&
     (uVar30 = *(uint *)&(conn->bits).field_0x4, (uVar30 & 0x20) != 0)) {
    *(uint *)&(conn->bits).field_0x4 = uVar30 | 0x4000;
  }
  lVar18 = (data->set).use_port;
  if ((lVar18 == 0) || (((data->state).field_0x4e4 & 0x10) == 0)) {
LAB_0048aefd:
    CVar8 = CURLUE_OK;
    bVar36 = true;
  }
  else {
    conn->remote_port = (uint)lVar18 & 0xffff;
    bVar36 = false;
    curl_msnprintf((char *)local_238,0x10,"%d");
    CVar9 = curl_url_set((data->state).uh,CURLUPART_PORT,(char *)local_238,0);
    CVar8 = CURLUE_NO_QUERY|CURLUE_NO_USER;
    if (CVar9 == CURLUE_OK) goto LAB_0048aefd;
  }
  if (!bVar36) goto LAB_0048b1c5;
  ppcVar35 = &conn->user;
  passwordp = &conn->passwd;
  if (((data->set).use_netrc == CURL_NETRC_REQUIRED) && (((conn->bits).field_0x4 & 0x80) != 0)) {
    bVar36 = *ppcVar35 != (char *)0x0;
    if (bVar36) {
      (*Curl_cfree)(*ppcVar35);
      *ppcVar35 = (char *)0x0;
    }
    bVar37 = *passwordp != (char *)0x0;
    if (bVar37) {
      (*Curl_cfree)(*passwordp);
      *passwordp = (char *)0x0;
    }
    puVar29 = &(conn->bits).field_0x4;
    *puVar29 = *puVar29 & 0x7f;
  }
  else {
    bVar36 = false;
    bVar37 = false;
  }
  if ((data->set).str[0x2c] != (char *)0x0) {
    (*Curl_cfree)(*ppcVar35);
    pcVar14 = (*Curl_cstrdup)((data->set).str[0x2c]);
    *ppcVar35 = pcVar14;
    if (pcVar14 != (char *)0x0) {
      puVar29 = &(conn->bits).field_0x4;
      *puVar29 = *puVar29 | 0x80;
      bVar36 = true;
      goto LAB_0048afda;
    }
switchD_0048b149_caseD_7:
    CVar9 = CURLUE_NO_QUERY|CURLUE_NO_USER;
    goto switchD_0048b187_caseD_1;
  }
LAB_0048afda:
  if ((data->set).str[0x2d] != (char *)0x0) {
    (*Curl_cfree)(*passwordp);
    pcVar14 = (*Curl_cstrdup)((data->set).str[0x2d]);
    *passwordp = pcVar14;
    if (pcVar14 == (char *)0x0) goto switchD_0048b149_caseD_7;
    puVar29 = &(conn->bits).field_0x4;
    *puVar29 = *puVar29 | 0x80;
    bVar37 = true;
  }
  if ((data->set).str[0x2e] != (char *)0x0) {
    (*Curl_cfree)(conn->options);
    pcVar14 = (*Curl_cstrdup)((data->set).str[0x2e]);
    conn->options = pcVar14;
    if (pcVar14 == (char *)0x0) goto switchD_0048b149_caseD_7;
  }
  puVar29 = &(conn->bits).field_0x6;
  *puVar29 = *puVar29 & 0xef;
  if (((data->set).use_netrc != CURL_NETRC_IGNORED) &&
     ((((*ppcVar35 == (char *)0x0 || (**ppcVar35 == '\0')) || (*passwordp == (char *)0x0)) ||
      (**passwordp == '\0')))) {
    local_238[0]._0_1_ = '\0';
    local_138[0]._0_1_ = '\0';
    iVar10 = Curl_parsenetrc((conn->host).name,ppcVar35,passwordp,(_Bool *)local_238,
                             (_Bool *)local_138,(data->set).str[0x14]);
    if (iVar10 < 1) {
      if (-1 < iVar10) {
        puVar29 = &(conn->bits).field_0x4;
        *(uint *)puVar29 = *(uint *)puVar29 | 0x100080;
        if ((char)local_238[0] != '\0') {
          bVar36 = true;
        }
        if ((char)local_138[0] != '\0') {
          bVar37 = true;
        }
        goto LAB_0048b109;
      }
      bVar4 = false;
    }
    else {
      Curl_infof(data,"Couldn\'t find host %s in the .netrc file; using defaults\n",
                 (conn->host).name);
LAB_0048b109:
      bVar4 = true;
    }
    if (!bVar4) goto switchD_0048b149_caseD_7;
  }
  if (bVar36) {
    bVar36 = false;
    CVar9 = curl_url_set((data->state).uh,CURLUPART_USER,*ppcVar35,0);
    CVar8 = CURLUE_MALFORMED_INPUT;
    switch(CVar9) {
    case CURLUE_OK:
      goto switchD_0048b149_caseD_0;
    default:
      goto switchD_0048b149_caseD_1;
    case CURLUE_UNSUPPORTED_SCHEME:
switchD_0048b149_caseD_5:
      CVar9 = CURLUE_BAD_HANDLE;
      break;
    case CURLUE_OUT_OF_MEMORY:
      goto switchD_0048b149_caseD_7;
    case CURLUE_USER_NOT_ALLOWED:
switchD_0048b149_caseD_8:
      CVar9 = 0x43;
    }
switchD_0048b187_caseD_1:
    CVar8 = CVar9;
    bVar36 = false;
  }
  else {
switchD_0048b149_caseD_0:
    CVar8 = CURLUE_OK;
    bVar36 = true;
    if (bVar37) {
      CVar8 = curl_url_set((data->state).uh,CURLUPART_PASSWORD,*passwordp,0);
      CVar9 = CURLUE_MALFORMED_INPUT;
      switch(CVar8) {
      case CURLUE_OK:
        break;
      default:
        goto switchD_0048b187_caseD_1;
      case CURLUE_UNSUPPORTED_SCHEME:
        goto switchD_0048b149_caseD_5;
      case CURLUE_OUT_OF_MEMORY:
        goto switchD_0048b149_caseD_7;
      case CURLUE_USER_NOT_ALLOWED:
        goto switchD_0048b149_caseD_8;
      }
    }
  }
switchD_0048b149_caseD_1:
  if (((!bVar36) || (CVar8 = set_login(conn), CVar8 != CURLUE_OK)) ||
     (CVar8 = parse_connect_to_slist(data,conn,(data->set).connect_to), CVar8 != CURLUE_OK))
  goto LAB_0048b1c5;
  pCVar28 = conn->data;
  pcVar14 = (conn->host).name;
  (conn->host).dispname = pcVar14;
  do {
    cVar6 = *pcVar14;
    pcVar14 = pcVar14 + 1;
  } while ('\0' < cVar6);
  if (cVar6 != '\0') {
    Curl_infof(pCVar28,"IDN support not present, can\'t parse Unicode domains\n");
  }
  if (((conn->bits).field_0x4 & 4) != 0) {
    pCVar28 = conn->data;
    pcVar14 = (conn->conn_to_host).name;
    (conn->conn_to_host).dispname = pcVar14;
    do {
      cVar6 = *pcVar14;
      pcVar14 = pcVar14 + 1;
    } while ('\0' < cVar6);
    if (cVar6 != '\0') {
      Curl_infof(pCVar28,"IDN support not present, can\'t parse Unicode domains\n");
    }
  }
  if (((conn->bits).field_0x4 & 0x20) != 0) {
    pCVar28 = conn->data;
    pcVar14 = (conn->http_proxy).host.name;
    (conn->http_proxy).host.dispname = pcVar14;
    do {
      cVar6 = *pcVar14;
      pcVar14 = pcVar14 + 1;
    } while ('\0' < cVar6);
    if (cVar6 != '\0') {
      Curl_infof(pCVar28,"IDN support not present, can\'t parse Unicode domains\n");
    }
  }
  if (((conn->bits).field_0x4 & 0x40) != 0) {
    pCVar28 = conn->data;
    pcVar14 = (conn->socks_proxy).host.name;
    (conn->socks_proxy).host.dispname = pcVar14;
    do {
      cVar6 = *pcVar14;
      pcVar14 = pcVar14 + 1;
    } while ('\0' < cVar6);
    if (cVar6 != '\0') {
      Curl_infof(pCVar28,"IDN support not present, can\'t parse Unicode domains\n");
    }
  }
  if ((((conn->bits).field_0x4 & 4) != 0) &&
     (iVar10 = Curl_strcasecompare((conn->conn_to_host).name,(conn->host).name), iVar10 != 0)) {
    puVar29 = &(conn->bits).field_0x4;
    *puVar29 = *puVar29 & 0xfb;
  }
  uVar30 = *(uint *)&(conn->bits).field_0x4;
  if (((uVar30 & 8) != 0) && (conn->conn_to_port == conn->remote_port)) {
    *(uint *)&(conn->bits).field_0x4 = uVar30 & 0xfffffff7;
  }
  uVar30 = *(uint *)&(conn->bits).field_0x4;
  if ((uVar30 & 0x20) != 0 && (uVar30 & 0xc) != 0) {
    *(uint *)&(conn->bits).field_0x4 = uVar30 | 0x4000;
  }
  conn->socktype = 1;
  pCVar31 = conn->handler;
  if (pCVar31->setup_connection == (_func_CURLcode_connectdata_ptr *)0x0) {
LAB_0048b3cc:
    CVar8 = CURLUE_OK;
    if (conn->port < 0) {
      conn->port = pCVar31->defport;
    }
  }
  else {
    CVar8 = (*pCVar31->setup_connection)(conn);
    if (CVar8 == CURLUE_OK) {
      pCVar31 = conn->handler;
      goto LAB_0048b3cc;
    }
  }
  if (CVar8 != CURLUE_OK) goto LAB_0048b1c5;
  conn->recv[0] = Curl_recv_plain;
  conn->send[0] = Curl_send_plain;
  conn->recv[1] = Curl_recv_plain;
  conn->send[1] = Curl_send_plain;
  *(uint *)&(conn->bits).field_0x4 =
       *(uint *)&(conn->bits).field_0x4 & 0xf7ffffff |
       (uint)(*(ulong *)&(data->set).field_0x878 >> 0x11) & 0x8000000;
  if ((conn->handler->flags & 0x10) != 0) {
    Curl_persistconninfo(conn);
    CVar8 = (*conn->handler->connect_it)(conn,(_Bool *)local_238);
    if (CVar8 == CURLUE_OK) {
      (conn->bits).tcpconnect[0] = true;
      CVar8 = Curl_conncache_add_conn((data->state).conn_cache,conn);
      if (CVar8 != CURLUE_OK) goto LAB_0048b1c5;
      CVar8 = setup_range(data);
      if (CVar8 != CURLUE_OK) {
        (*conn->handler->done)(conn,CVar8,false);
        goto LAB_0048b1c5;
      }
      Curl_attach_connnection(data,conn);
      CVar8 = CURLUE_OK;
      Curl_setup_transfer(data,-1,-1,false,-1);
    }
    Curl_init_do(data,conn);
    goto LAB_0048b1c5;
  }
  pcVar14 = (data->set).str[0x1b];
  (data->set).ssl.primary.CApath = (data->set).str[0x1a];
  (data->set).proxy_ssl.primary.CApath = pcVar14;
  (data->set).ssl.primary.CAfile = (data->set).str[0x1c];
  (data->set).proxy_ssl.primary.CAfile = (data->set).str[0x1d];
  pcVar14 = (data->set).str[0x25];
  (data->set).ssl.primary.random_file = pcVar14;
  (data->set).proxy_ssl.primary.random_file = pcVar14;
  pcVar14 = (data->set).str[0x24];
  (data->set).ssl.primary.egdsocket = pcVar14;
  (data->set).proxy_ssl.primary.egdsocket = pcVar14;
  (data->set).ssl.primary.cipher_list = (data->set).str[0x20];
  (data->set).proxy_ssl.primary.cipher_list = (data->set).str[0x21];
  (data->set).ssl.primary.cipher_list13 = (data->set).str[0x22];
  (data->set).proxy_ssl.primary.cipher_list13 = (data->set).str[0x23];
  (data->set).ssl.CRLfile = (data->set).str[0x27];
  (data->set).proxy_ssl.CRLfile = (data->set).str[0x28];
  (data->set).ssl.issuercert = (data->set).str[0x29];
  (data->set).proxy_ssl.issuercert = (data->set).str[0x2a];
  pcVar14 = (data->set).str[0];
  pcVar16 = (data->set).str[1];
  (data->set).ssl.cert = pcVar14;
  (data->set).proxy_ssl.cert = pcVar16;
  (data->set).ssl.cert_type = (data->set).str[2];
  (data->set).proxy_ssl.cert_type = (data->set).str[3];
  pcVar3 = (data->set).str[0xe];
  (data->set).ssl.key = (data->set).str[0xd];
  (data->set).proxy_ssl.key = pcVar3;
  (data->set).ssl.key_type = (data->set).str[0x11];
  (data->set).proxy_ssl.key_type = (data->set).str[0x12];
  (data->set).ssl.key_passwd = (data->set).str[0xf];
  (data->set).proxy_ssl.key_passwd = (data->set).str[0x10];
  (data->set).ssl.primary.clientcert = pcVar14;
  (data->set).proxy_ssl.primary.clientcert = pcVar16;
  _Var5 = Curl_clone_primary_ssl_config(&(data->set).ssl.primary,&conn->ssl_config);
  CVar8 = CURLUE_NO_QUERY|CURLUE_NO_USER;
  if ((!_Var5) ||
     (_Var5 = Curl_clone_primary_ssl_config(&(data->set).proxy_ssl.primary,&conn->proxy_ssl_config),
     !_Var5)) goto LAB_0048b1c5;
  prune_dead_connections(data);
  uVar21 = *(ulong *)&(data->set).field_0x878;
  if ((uVar21 >> 0x21 & 1) == 0) {
    if ((uVar21 & 0x2000000000) == 0) {
LAB_0048b773:
      _Var5 = ConnectionExists(data,conn,&local_278,&local_2a1,&local_2a2);
    }
    else {
      _Var5 = false;
    }
  }
  else {
    _Var5 = false;
    if (((uVar21 & 0x2000000000) == 0) && ((*(ushort *)&(data->state).field_0x4e4 & 2) != 0))
    goto LAB_0048b773;
  }
  pcVar19 = local_278;
  if ((((_Var5 != false) && (local_2a1 == false)) &&
      (iVar10 = IsMultiplexingPossible(data,local_278), iVar10 != 0)) &&
     ((pcVar19->easyq).size != 0)) {
    Curl_infof(data,"Found connection %ld, with %zu requests on it\n",pcVar19->connection_id);
    sVar11 = Curl_conncache_bundle_size(pcVar19);
    if ((sVar11 < local_288) && (sVar11 = Curl_conncache_size(data), sVar11 < local_280)) {
      _Var5 = false;
      Curl_infof(data,"We can reuse, but we want a new connection anyway\n");
      Curl_conncache_return_conn(pcVar19);
    }
  }
  pcVar19 = local_278;
  if (_Var5 == false) {
    if ((conn->handler->flags & 0x100) != 0) {
      if (((data->set).field_0x87d & 0x40) != 0) {
        puVar29 = &(conn->bits).field_0x7;
        *puVar29 = *puVar29 | 0x20;
      }
      if (((data->set).field_0x87d & 0x20) != 0) {
        puVar29 = &(conn->bits).field_0x7;
        *puVar29 = *puVar29 | 0x10;
      }
    }
    if (local_2a2 == false) {
      bundle = Curl_conncache_find_bundle(conn,(data->state).conn_cache);
      if ((bundle == (connectbundle *)0x0 || local_288 == 0) ||
         (bundle->num_connections < local_288)) {
        Curl_conncache_unlock(data);
      }
      else {
        pcVar19 = Curl_conncache_extract_bundle(data,bundle);
        Curl_conncache_unlock(data);
        if (pcVar19 == (connectdata *)0x0) {
          bVar36 = false;
          Curl_infof(data,"No more connections allowed to host: %zu\n",local_288);
          goto LAB_0048b934;
        }
        Curl_disconnect(data,pcVar19,false);
      }
      bVar36 = true;
    }
    else {
      bVar36 = false;
    }
LAB_0048b934:
    if (((bool)(local_280 != 0 & bVar36)) &&
       (sVar11 = Curl_conncache_size(data), local_280 <= sVar11)) {
      pcVar19 = Curl_conncache_extract_oldest(data);
      if (pcVar19 == (connectdata *)0x0) {
        bVar36 = false;
        Curl_infof(data,"No connections available in cache\n");
      }
      else {
        Curl_disconnect(data,pcVar19,false);
      }
    }
    if (!bVar36) {
      Curl_infof(data,"No connections available.\n");
      conn_free(conn);
      CVar8 = 0x59;
LAB_0048a494:
      conn = (connectdata *)0x0;
      goto LAB_0048b1c5;
    }
    CVar8 = Curl_conncache_add_conn((data->state).conn_cache,conn);
    if (CVar8 != CURLUE_OK) goto LAB_0048b1c5;
    if ((((data->state).authhost.picked & 0x28) != 0) &&
       (((data->state).authhost.field_0x18 & 1) != 0)) {
      Curl_infof(data,"NTLM picked AND auth done set, clear picked!\n");
      (data->state).authhost.picked = 0;
      puVar29 = &(data->state).authhost.field_0x18;
      *puVar29 = *puVar29 & 0xfe;
    }
    if ((((data->state).authproxy.picked & 0x28) != 0) &&
       (((data->state).authproxy.field_0x18 & 1) != 0)) {
      Curl_infof(data,"NTLM-proxy picked AND auth done set, clear picked!\n");
      (data->state).authproxy.picked = 0;
      puVar29 = &(data->state).authproxy.field_0x18;
      *puVar29 = *puVar29 & 0xfe;
    }
  }
  else {
    reuse_conn(conn,local_278);
    (*Curl_cfree)(conn->ssl_extra);
    (*Curl_cfree)(conn);
    pcVar14 = "proxy";
    if (((pcVar19->bits).field_0x4 & 0x10) == 0) {
      pcVar14 = "host";
    }
    lVar18 = 0x128;
    if (((pcVar19->socks_proxy).host.name == (char *)0x0) &&
       (lVar18 = 0x168, (pcVar19->http_proxy).host.name == (char *)0x0)) {
      lVar18 = 0xd8;
    }
    Curl_infof(data,"Re-using existing connection! (#%ld) with %s %s\n",pcVar19->connection_id,
               pcVar14,*(undefined8 *)((pcVar19->chunk).hexbuffer + lVar18 + -0x20));
    conn = pcVar19;
  }
  Curl_init_do(data,conn);
  CVar8 = setup_range(data);
  if (CVar8 == CURLUE_OK) {
    conn->seek_func = (data->set).seek_func;
    conn->seek_client = (data->set).seek_client;
    CVar8 = resolve_server(data,conn,local_260);
    strip_trailing_dot(&conn->host);
    if (((conn->bits).field_0x4 & 0x20) != 0) {
      strip_trailing_dot(&(conn->http_proxy).host);
    }
    if (((conn->bits).field_0x4 & 0x40) != 0) {
      strip_trailing_dot(&(conn->socks_proxy).host);
    }
    if (((conn->bits).field_0x4 & 4) != 0) {
      strip_trailing_dot(&conn->conn_to_host);
    }
  }
LAB_0048b1c5:
  if (CVar8 == CURLUE_OK) {
    if ((conn->easyq).size == 0) {
      CVar8 = CURLUE_OK;
      if (*local_260 == false) {
        CVar8 = Curl_setup_conn(conn,local_258);
      }
    }
    else {
      *local_258 = true;
      CVar8 = CURLUE_OK;
    }
  }
  if (CVar8 != 0x59) {
    if ((conn == (connectdata *)0x0) || (CVar8 == CURLUE_OK)) {
      if ((CVar8 == CURLUE_OK) && (data->conn == (connectdata *)0x0)) {
        Curl_attach_connnection(data,conn);
      }
    }
    else {
      Curl_disconnect(data,conn,true);
    }
  }
  return CVar8;
}

Assistant:

CURLcode Curl_connect(struct Curl_easy *data,
                      bool *asyncp,
                      bool *protocol_done)
{
  CURLcode result;
  struct connectdata *conn;

  *asyncp = FALSE; /* assume synchronous resolves by default */

  /* init the single-transfer specific data */
  Curl_free_request_state(data);
  memset(&data->req, 0, sizeof(struct SingleRequest));
  data->req.maxdownload = -1;

  /* call the stuff that needs to be called */
  result = create_conn(data, &conn, asyncp);

  if(!result) {
    if(CONN_INUSE(conn))
      /* multiplexed */
      *protocol_done = TRUE;
    else if(!*asyncp) {
      /* DNS resolution is done: that's either because this is a reused
         connection, in which case DNS was unnecessary, or because DNS
         really did finish already (synch resolver/fast async resolve) */
      result = Curl_setup_conn(conn, protocol_done);
    }
  }

  if(result == CURLE_NO_CONNECTION_AVAILABLE) {
    return result;
  }
  else if(result && conn) {
    /* We're not allowed to return failure with memory left allocated in the
       connectdata struct, free those here */
    Curl_disconnect(data, conn, TRUE);
  }
  else if(!result && !data->conn)
    /* FILE: transfers already have the connection attached */
    Curl_attach_connnection(data, conn);

  return result;
}